

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_hexadecimal_integer<std::vector<char,std::allocator<char>>>
          (result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  const_iterator rollback;
  value_type *pvVar2;
  void *this_00;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_411;
  location<std::vector<char,_std::allocator<char>_>_> *local_410;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_408;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  undefined1 local_3d8 [47];
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  char *local_348;
  int local_33c;
  pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> local_338;
  success<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
  local_2e8;
  long local_298;
  integer retval;
  istringstream iss;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  undefined8 local_100;
  undefined8 local_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined8 local_d0;
  char local_c1;
  char *local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined8 local_a8 [3];
  undefined1 local_90 [8];
  string str;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  const_iterator first;
  location<std::vector<char,_std::allocator<char>_>_> *loc_local;
  
  rollback = location<std::vector<char,_std::allocator<char>_>_>::iter
                       ((location<std::vector<char,_std::allocator<char>_>_> *)this);
  sequence<toml::detail::sequence<toml::detail::character<(char)48>,toml::detail::character<(char)120>>,toml::detail::sequence<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>>>,toml::detail::unlimited>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              *)((long)&str.field_2 + 8),
             (sequence<toml::detail::sequence<toml::detail::character<(char)48>,toml::detail::character<(char)120>>,toml::detail::sequence<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>>>,toml::detail::unlimited>>>
              *)this,loc_00);
  bVar1 = toml::result::operator_cast_to_bool((result *)(str.field_2._M_local_buf + 8));
  if (bVar1) {
    pvVar2 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                       *)((long)&str.field_2 + 8));
    region<std::vector<char,std::allocator<char>>>::str_abi_cxx11_((string *)local_90,pvVar2);
    local_b8._M_current = (char *)std::__cxx11::string::begin();
    local_c0 = (char *)std::__cxx11::string::end();
    local_c1 = '_';
    local_b0 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                         (local_b8,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_c0,&local_c1);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_a8,&local_b0);
    local_d8._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_d0,&local_d8);
    local_e0 = std::__cxx11::string::erase(local_90,local_a8[0],local_d0);
    local_f0._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_e8,&local_f0);
    local_f8 = std::__cxx11::string::erase(local_90,local_e8);
    local_108._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_100,&local_108);
    std::__cxx11::string::erase(local_90,local_100);
    std::__cxx11::istringstream::istringstream((istringstream *)&retval,(string *)local_90,_S_in);
    local_298 = 0;
    this_00 = (void *)std::istream::operator>>(&retval,std::hex);
    std::istream::operator>>(this_00,&local_298);
    pvVar2 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                       *)((long)&str.field_2 + 8));
    std::make_pair<long&,toml::detail::region<std::vector<char,std::allocator<char>>>const&>
              (&local_338,&local_298,pvVar2);
    ok<std::pair<long,toml::detail::region<std::vector<char,std::allocator<char>>>>>
              (&local_2e8,(toml *)&local_338,v);
    result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_2e8);
    success<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>::
    ~success(&local_2e8);
    std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::~pair
              (&local_338);
    local_33c = 1;
    std::__cxx11::istringstream::~istringstream((istringstream *)&retval);
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    local_33c = 0;
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  ~result((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *)((long)&str.field_2 + 8));
  if (local_33c == 0) {
    local_348 = rollback._M_current;
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"[error] toml::parse_hexadecimal_integer",&local_3a9);
    local_408 = &local_400;
    local_410 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
    std::
    pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[33],_true>
              (local_408,&local_410,(char (*) [33])"the next token is not an integer");
    local_3d8._0_8_ = &local_400;
    local_3d8._8_8_ = 1;
    std::
    allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_411);
    __l._M_len = local_3d8._8_8_;
    __l._M_array = (iterator)local_3d8._0_8_;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_3d8 + 0x10),__l,&local_411);
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_438);
    format_underline(&local_388,&local_3a8,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_3d8 + 0x10),&local_438);
    err<std::__cxx11::string>(&local_368,(toml *)&local_388,v_00);
    result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_368);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_438);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_3d8 + 0x10));
    std::
    allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_411);
    local_4c0 = (pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_3d8;
    do {
      local_4c0 = local_4c0 + -1;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_4c0);
    } while (local_4c0 != &local_400);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<integer, region<Container>>, std::string>
parse_hexadecimal_integer(location<Container>& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_hex_int::invoke(loc))
    {
        auto str = token.unwrap().str();
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());
        str.erase(str.begin()); str.erase(str.begin()); // remove `0x` prefix

        std::istringstream iss(str);
        integer retval(0);
        iss >> std::hex >> retval;
        return ok(std::make_pair(retval, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("[error] toml::parse_hexadecimal_integer",
               {{std::addressof(loc), "the next token is not an integer"}}));
}